

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

xmlXPathObjectPtr load_xpath_expr(xmlDocPtr parent_doc,char *filename)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  _xmlNs *local_50;
  xmlNsPtr ns;
  xmlNodePtr node;
  xmlXPathContextPtr_conflict ctx;
  xmlChar *expr;
  xmlDocPtr doc;
  xmlXPathObjectPtr xpath;
  char *filename_local;
  xmlDocPtr parent_doc_local;
  
  lVar2 = xmlReadFile(filename,0,10);
  if (lVar2 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",filename);
    parent_doc_local = (xmlDocPtr)0x0;
  }
  else {
    lVar3 = xmlDocGetRootElement(lVar2);
    if (lVar3 == 0) {
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",filename);
      xmlFreeDoc(lVar2);
      parent_doc_local = (xmlDocPtr)0x0;
    }
    else {
      ns = *(xmlNsPtr *)(lVar2 + 0x18);
      while( true ) {
        bVar5 = false;
        if (ns != (xmlNsPtr)0x0) {
          iVar1 = xmlStrEqual(ns->href,"XPath");
          bVar5 = iVar1 == 0;
        }
        if (!bVar5) break;
        ns = ns[1].next;
      }
      if (ns == (xmlNsPtr)0x0) {
        fprintf(_stderr,"Error: XPath element expected in the file  \"%s\"\n",filename);
        xmlFreeDoc(lVar2);
        parent_doc_local = (xmlDocPtr)0x0;
      }
      else {
        lVar3 = xmlNodeGetContent(ns);
        if (lVar3 == 0) {
          fprintf(_stderr,"Error: XPath content element is NULL \"%s\"\n",filename);
          xmlFreeDoc(lVar2);
          parent_doc_local = (xmlDocPtr)0x0;
        }
        else {
          lVar4 = xmlXPathNewContext(parent_doc);
          if (lVar4 == 0) {
            fprintf(_stderr,"Error: unable to create new context\n");
            (*_xmlFree)(lVar3);
            xmlFreeDoc(lVar2);
            parent_doc_local = (xmlDocPtr)0x0;
          }
          else {
            for (local_50 = ns[2].next; local_50 != (_xmlNs *)0x0; local_50 = local_50->next) {
              iVar1 = xmlXPathRegisterNs(lVar4,local_50->prefix,local_50->href);
              if (iVar1 != 0) {
                fprintf(_stderr,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n",
                        local_50->prefix,local_50->href);
                (*_xmlFree)(lVar3);
                xmlXPathFreeContext(lVar4);
                xmlFreeDoc(lVar2);
                return (xmlXPathObjectPtr)0x0;
              }
            }
            parent_doc_local = (xmlDocPtr)xmlXPathEvalExpression(lVar3,lVar4);
            if (parent_doc_local == (xmlDocPtr)0x0) {
              fprintf(_stderr,"Error: unable to evaluate xpath expression\n");
              (*_xmlFree)(lVar3);
              xmlXPathFreeContext(lVar4);
              xmlFreeDoc(lVar2);
              parent_doc_local = (xmlDocPtr)0x0;
            }
            else {
              (*_xmlFree)(lVar3);
              xmlXPathFreeContext(lVar4);
              xmlFreeDoc(lVar2);
            }
          }
        }
      }
    }
  }
  return (xmlXPathObjectPtr)parent_doc_local;
}

Assistant:

static xmlXPathObjectPtr
load_xpath_expr (xmlDocPtr parent_doc, const char* filename) {
    xmlXPathObjectPtr xpath;
    xmlDocPtr doc;
    xmlChar *expr;
    xmlXPathContextPtr ctx;
    xmlNodePtr node;
    xmlNsPtr ns;

    /*
     * load XPath expr as a file
     */
    doc = xmlReadFile(filename, NULL, XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (doc == NULL) {
	fprintf(stderr, "Error: unable to parse file \"%s\"\n", filename);
	return(NULL);
    }

    /*
     * Check the document is of the right kind
     */
    if(xmlDocGetRootElement(doc) == NULL) {
        fprintf(stderr,"Error: empty document for file \"%s\"\n", filename);
	xmlFreeDoc(doc);
	return(NULL);
    }

    node = doc->children;
    while(node != NULL && !xmlStrEqual(node->name, (const xmlChar *)"XPath")) {
	node = node->next;
    }

    if(node == NULL) {
        fprintf(stderr,"Error: XPath element expected in the file  \"%s\"\n", filename);
	xmlFreeDoc(doc);
	return(NULL);
    }

    expr = xmlNodeGetContent(node);
    if(expr == NULL) {
        fprintf(stderr,"Error: XPath content element is NULL \"%s\"\n", filename);
	xmlFreeDoc(doc);
	return(NULL);
    }

    ctx = xmlXPathNewContext(parent_doc);
    if(ctx == NULL) {
        fprintf(stderr,"Error: unable to create new context\n");
        xmlFree(expr);
        xmlFreeDoc(doc);
        return(NULL);
    }

    /*
     * Register namespaces
     */
    ns = node->nsDef;
    while(ns != NULL) {
	if(xmlXPathRegisterNs(ctx, ns->prefix, ns->href) != 0) {
	    fprintf(stderr,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n", ns->prefix, ns->href);
    xmlFree(expr);
	    xmlXPathFreeContext(ctx);
	    xmlFreeDoc(doc);
	    return(NULL);
	}
	ns = ns->next;
    }

    /*
     * Evaluate xpath
     */
    xpath = xmlXPathEvalExpression(expr, ctx);
    if(xpath == NULL) {
        fprintf(stderr,"Error: unable to evaluate xpath expression\n");
xmlFree(expr);
        xmlXPathFreeContext(ctx);
        xmlFreeDoc(doc);
        return(NULL);
    }

    /* print_xpath_nodes(xpath->nodesetval); */

    xmlFree(expr);
    xmlXPathFreeContext(ctx);
    xmlFreeDoc(doc);
    return(xpath);
}